

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

int ly_vlog_build_path(LY_VLOG_ELEM elem_type,void *elem,char **path,int schema_all_prefixes,
                      int data_no_last_predicate)

{
  char **ppcVar1;
  int iVar2;
  char *pcVar3;
  lys_node *plVar4;
  lys_module *plVar5;
  lys_module *plVar6;
  size_t sVar7;
  bool bVar8;
  char *local_b0;
  long local_a0;
  size_t len;
  uint16_t index;
  char *pcStack_90;
  uint16_t length;
  char *str;
  char *ext_name;
  char *val_start;
  char *val_end;
  char *prefix;
  char *name;
  lys_module *top_smodule;
  lyd_node *diter;
  lyd_node *dlist;
  lys_node *sparent;
  lys_node_list *slist;
  uint local_30;
  int yang_data_extension;
  int j;
  int i;
  int data_no_last_predicate_local;
  int schema_all_prefixes_local;
  char **path_local;
  void *elem_local;
  LY_VLOG_ELEM elem_type_local;
  
  slist._4_4_ = 0;
  dlist = (lyd_node *)0x0;
  name = (char *)0x0;
  val_end = (char *)0x0;
  len._6_2_ = 0;
  j = data_no_last_predicate;
  i = schema_all_prefixes;
  _data_no_last_predicate_local = path;
  path_local = (char **)elem;
  elem_local._0_4_ = elem_type;
  pcVar3 = (char *)malloc(1);
  *_data_no_last_predicate_local = pcVar3;
  if (*_data_no_last_predicate_local == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_vlog_build_path");
  }
  else {
    len._4_2_ = 0;
    do {
      do {
        if (path_local == (char **)0x0) {
LAB_00111c99:
          memmove(*_data_no_last_predicate_local,
                  *_data_no_last_predicate_local + (int)(uint)len._4_2_,(ulong)len._6_2_);
          (*_data_no_last_predicate_local)[len._6_2_] = '\0';
          return 0;
        }
        if (2 < (LY_VLOG_ELEM)elem_local - LY_VLOG_XML && (LY_VLOG_ELEM)elem_local != LY_VLOG_STR) {
          ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/log.c"
                 ,0x327);
          return -1;
        }
        switch((long)&switchD_001110af::switchdataD_001ead60 +
               (long)(int)(&switchD_001110af::switchdataD_001ead60)
                          [(LY_VLOG_ELEM)elem_local - LY_VLOG_XML]) {
        case 0x1110b1:
          prefix = path_local[6];
          if (path_local[7] == (char *)0x0) {
            local_b0 = (char *)0x0;
          }
          else {
            local_b0 = *(char **)(path_local[7] + 0x18);
          }
          val_end = local_b0;
          path_local = (char **)path_local[1];
          break;
        case 0x111104:
          if (name == (char *)0x0) {
            dlist = (lyd_node *)path_local;
            while (plVar4 = lys_parent((lys_node *)dlist), plVar4 != (lys_node *)0x0) {
              dlist = (lyd_node *)lys_parent((lys_node *)dlist);
            }
            name = (char *)lys_node_module((lys_node *)dlist);
          }
          dlist = (lyd_node *)lys_parent((lys_node *)path_local);
          while( true ) {
            bVar8 = false;
            if (dlist != (lyd_node *)0x0) {
              bVar8 = *(int *)&dlist->ht == 0x1000;
            }
            if (!bVar8) break;
            dlist = (lyd_node *)lys_parent((lys_node *)dlist);
          }
          if (((dlist == (lyd_node *)0x0) ||
              (plVar5 = lys_node_module((lys_node *)path_local), plVar5 != (lys_module *)name)) ||
             (i != 0)) {
            plVar5 = lys_node_module((lys_node *)path_local);
            val_end = plVar5->name;
          }
          else {
            val_end = (char *)0x0;
          }
          if (((ulong)path_local[7] & 0x2800) == 0) {
            if (*(int *)(path_local + 7) == 0x10000) {
              prefix = *(char **)*path_local;
              iVar2 = strcmp(prefix,"yang-data");
              if (iVar2 == 0) {
                slist._4_4_ = 1;
                prefix = path_local[2];
                plVar5 = lys_node_module((lys_node *)path_local);
                val_end = plVar5->name;
              }
            }
            else {
              prefix = *path_local;
            }
          }
          else {
            iVar2 = ly_vlog_build_path_print
                              (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),"]",1,
                               (uint16_t *)((long)&len + 6));
            ppcVar1 = _data_no_last_predicate_local;
            if (iVar2 != 0) {
              return -1;
            }
            pcVar3 = *path_local;
            prefix = pcVar3;
            sVar7 = strlen(pcVar3);
            iVar2 = ly_vlog_build_path_print
                              (ppcVar1,(uint16_t *)((long)&len + 4),pcVar3,(uint16_t)sVar7,
                               (uint16_t *)((long)&len + 6));
            if (iVar2 != 0) {
              return -1;
            }
            if (*(int *)(path_local + 7) == 0x800) {
              prefix = "{grouping}[";
            }
            else {
              prefix = "{augment}[";
            }
          }
          if (*(int *)(path_local + 7) == 0x10000) {
            if (*(char *)((long)path_local + 0x1d) == '\x01') {
              path_local = (char **)path_local[1];
            }
            else {
              dlist = (lyd_node *)0x0;
              path_local = (char **)0x0;
            }
          }
          else {
            do {
              dlist = (lyd_node *)path_local[8];
              path_local = &lys_parent((lys_node *)path_local)->name;
              bVar8 = false;
              if ((lys_node *)path_local != (lys_node *)0x0) {
                bVar8 = ((lys_node *)path_local)->nodetype == LYS_USES;
              }
            } while (bVar8);
          }
          break;
        case 0x11137e:
          prefix = *(char **)*path_local;
          if (path_local[5] == (char *)0x0) {
LAB_001113c3:
            plVar5 = lyd_node_module((lyd_node *)path_local);
            val_end = plVar5->name;
          }
          else {
            plVar5 = lyd_node_module((lyd_node *)path_local);
            plVar6 = lyd_node_module((lyd_node *)path_local[5]);
            if (plVar5 != plVar6) goto LAB_001113c3;
            val_end = (char *)0x0;
          }
          if ((j == 0) || (len._4_2_ != 0)) {
            if (*(int *)(*path_local + 0x38) == 0x10) {
              diter = (lyd_node *)path_local;
              sparent = (lys_node *)*path_local;
              if (sparent->padding[2] == '\0') {
                yang_data_extension = lyd_list_pos((lyd_node *)path_local);
                local_a0 = 1;
                for (local_30 = yang_data_extension; 9 < (int)local_30;
                    local_30 = (int)local_30 / 10) {
                  local_a0 = local_a0 + 1;
                }
                iVar2 = ly_vlog_build_path_print
                                  (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),"]",1,
                                   (uint16_t *)((long)&len + 6));
                if (iVar2 != 0) {
                  return -1;
                }
                pcStack_90 = (char *)malloc(local_a0 + 1);
                if (pcStack_90 == (char *)0x0) {
                  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "ly_vlog_build_path");
                  return -1;
                }
                sprintf(pcStack_90,"%d",(ulong)(uint)yang_data_extension);
                iVar2 = ly_vlog_build_path_print
                                  (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),
                                   pcStack_90,(uint16_t)local_a0,(uint16_t *)((long)&len + 6));
                if (iVar2 != 0) {
                  free(pcStack_90);
                  return -1;
                }
                free(pcStack_90);
                iVar2 = ly_vlog_build_path_print
                                  (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),"[",1,
                                   (uint16_t *)((long)&len + 6));
                if (iVar2 != 0) {
                  return -1;
                }
              }
              else {
                yang_data_extension = (int)sparent->padding[2];
                while (yang_data_extension = yang_data_extension - 1, -1 < yang_data_extension) {
                  for (top_smodule = (lys_module *)diter->child;
                      (top_smodule != (lys_module *)0x0 &&
                      (top_smodule->ctx !=
                       *(ly_ctx **)(*(long *)&sparent[1].flags + (long)yang_data_extension * 8)));
                      top_smodule = (lys_module *)top_smodule->dsc) {
                  }
                  if ((top_smodule != (lys_module *)0x0) && (top_smodule->filepath != (char *)0x0))
                  {
                    pcVar3 = strchr(top_smodule->filepath,0x27);
                    if (pcVar3 == (char *)0x0) {
                      pcVar3 = "[.=\'";
                      val_start = "\']";
                    }
                    else {
                      pcVar3 = "[.=\"";
                      val_start = "\"]";
                    }
                    ext_name = pcVar3 + 2;
                    iVar2 = ly_vlog_build_path_print
                                      (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),
                                       val_start,2,(uint16_t *)((long)&len + 6));
                    if (iVar2 != 0) {
                      return -1;
                    }
                    sVar7 = strlen(top_smodule->filepath);
                    iVar2 = ly_vlog_build_path_print
                                      (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),
                                       top_smodule->filepath,(uint16_t)sVar7,
                                       (uint16_t *)((long)&len + 6));
                    if (iVar2 != 0) {
                      return -1;
                    }
                    iVar2 = ly_vlog_build_path_print
                                      (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),
                                       ext_name,2,(uint16_t *)((long)&len + 6));
                    if (iVar2 != 0) {
                      return -1;
                    }
                    sVar7 = strlen((char *)(top_smodule->ctx->dict).hash_tab);
                    iVar2 = ly_vlog_build_path_print
                                      (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),
                                       (char *)(top_smodule->ctx->dict).hash_tab,(uint16_t)sVar7,
                                       (uint16_t *)((long)&len + 6));
                    if (iVar2 != 0) {
                      return -1;
                    }
                    plVar5 = lyd_node_module(diter);
                    plVar6 = lyd_node_module((lyd_node *)top_smodule);
                    if (plVar5 != plVar6) {
                      iVar2 = ly_vlog_build_path_print
                                        (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),
                                         ":",1,(uint16_t *)((long)&len + 6));
                      if (iVar2 != 0) {
                        return -1;
                      }
                      plVar5 = lyd_node_module((lyd_node *)top_smodule);
                      sVar7 = strlen(plVar5->name);
                      ppcVar1 = _data_no_last_predicate_local;
                      plVar5 = lyd_node_module((lyd_node *)top_smodule);
                      iVar2 = ly_vlog_build_path_print
                                        (ppcVar1,(uint16_t *)((long)&len + 4),plVar5->name,
                                         (uint16_t)sVar7,(uint16_t *)((long)&len + 6));
                      if (iVar2 != 0) {
                        return -1;
                      }
                    }
                    iVar2 = ly_vlog_build_path_print
                                      (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),
                                       "[",1,(uint16_t *)((long)&len + 6));
                    if (iVar2 != 0) {
                      return -1;
                    }
                  }
                }
              }
            }
            else if ((*(int *)(*path_local + 0x38) == 8) && (path_local[7] != (char *)0x0)) {
              pcVar3 = strchr(path_local[7],0x27);
              if (pcVar3 == (char *)0x0) {
                ext_name = "[.=\'";
                val_start = "\']";
              }
              else {
                ext_name = "[.=\"";
                val_start = "\"]";
              }
              iVar2 = ly_vlog_build_path_print
                                (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),
                                 val_start,2,(uint16_t *)((long)&len + 6));
              if (iVar2 != 0) {
                return -1;
              }
              sVar7 = strlen(path_local[7]);
              iVar2 = ly_vlog_build_path_print
                                (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),
                                 path_local[7],(uint16_t)sVar7,(uint16_t *)((long)&len + 6));
              if (iVar2 != 0) {
                return -1;
              }
              iVar2 = ly_vlog_build_path_print
                                (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),ext_name
                                 ,4,(uint16_t *)((long)&len + 6));
              if (iVar2 != 0) {
                return -1;
              }
            }
          }
          if ((path_local[5] == (char *)0x0) &&
             (str = lyp_get_yang_data_template_name((lyd_node *)path_local),
             ppcVar1 = _data_no_last_predicate_local, pcVar3 = prefix, str != (char *)0x0)) {
            sVar7 = strlen(prefix);
            iVar2 = ly_vlog_build_path_print
                              (ppcVar1,(uint16_t *)((long)&len + 4),pcVar3,(uint16_t)sVar7,
                               (uint16_t *)((long)&len + 6));
            if (iVar2 != 0) {
              return -1;
            }
            iVar2 = ly_vlog_build_path_print
                              (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),"/",1,
                               (uint16_t *)((long)&len + 6));
            if (iVar2 != 0) {
              return -1;
            }
            slist._4_4_ = 1;
            prefix = str;
          }
          path_local = (char **)path_local[5];
          break;
        case 0x111a45:
          sVar7 = strlen((char *)path_local);
          iVar2 = ly_vlog_build_path_print
                            (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),
                             (char *)path_local,(uint16_t)sVar7,(uint16_t *)((long)&len + 6));
          if (iVar2 != 0) {
            return -1;
          }
          goto LAB_00111c99;
        }
        ppcVar1 = _data_no_last_predicate_local;
        pcVar3 = prefix;
        if (prefix != (char *)0x0) {
          sVar7 = strlen(prefix);
          iVar2 = ly_vlog_build_path_print
                            (ppcVar1,(uint16_t *)((long)&len + 4),pcVar3,(uint16_t)sVar7,
                             (uint16_t *)((long)&len + 6));
          if (iVar2 != 0) {
            return -1;
          }
          if (val_end != (char *)0x0) {
            if ((slist._4_4_ != 0) &&
               (iVar2 = ly_vlog_build_path_print
                                  (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),"#",1,
                                   (uint16_t *)((long)&len + 6)), iVar2 != 0)) {
              return -1;
            }
            iVar2 = ly_vlog_build_path_print
                              (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),":",1,
                               (uint16_t *)((long)&len + 6));
            ppcVar1 = _data_no_last_predicate_local;
            pcVar3 = val_end;
            if (iVar2 != 0) {
              return -1;
            }
            sVar7 = strlen(val_end);
            iVar2 = ly_vlog_build_path_print
                              (ppcVar1,(uint16_t *)((long)&len + 4),pcVar3,(uint16_t)sVar7,
                               (uint16_t *)((long)&len + 6));
            if (iVar2 != 0) {
              return -1;
            }
          }
        }
        iVar2 = ly_vlog_build_path_print
                          (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),"/",1,
                           (uint16_t *)((long)&len + 6));
        if (iVar2 != 0) {
          return -1;
        }
      } while ((((LY_VLOG_ELEM)elem_local != LY_VLOG_LYS) || (path_local != (char **)0x0)) ||
              ((dlist == (lyd_node *)0x0 || (*(int *)&dlist->ht != 0x2000))));
      sVar7 = strlen((char *)dlist->schema);
      iVar2 = ly_vlog_build_path_print
                        (_data_no_last_predicate_local,(uint16_t *)((long)&len + 4),
                         (char *)dlist->schema,(uint16_t)sVar7,(uint16_t *)((long)&len + 6));
    } while (iVar2 == 0);
  }
  return -1;
}

Assistant:

int
ly_vlog_build_path(enum LY_VLOG_ELEM elem_type, const void *elem, char **path, int schema_all_prefixes, int data_no_last_predicate)
{
    int i, j, yang_data_extension = 0;
    struct lys_node_list *slist;
    struct lys_node *sparent = NULL;
    struct lyd_node *dlist, *diter;
    const struct lys_module *top_smodule = NULL;
    const char *name, *prefix = NULL, *val_end, *val_start, *ext_name;
    char *str;
    uint16_t length, index;
    size_t len;

    length = 0;
    *path = malloc(1);
    LY_CHECK_ERR_RETURN(!(*path), LOGMEM(NULL), -1);
    index = 0;

    while (elem) {
        switch (elem_type) {
        case LY_VLOG_XML:
            name = ((struct lyxml_elem *)elem)->name;
            prefix = ((struct lyxml_elem *)elem)->ns ? ((struct lyxml_elem *)elem)->ns->prefix : NULL;
            elem = ((struct lyxml_elem *)elem)->parent;
            break;
        case LY_VLOG_LYS:
            if (!top_smodule) {
                /* remember the top module, it will act as the current module */
                for (sparent = (struct lys_node *)elem; lys_parent(sparent); sparent = lys_parent(sparent));
                top_smodule = lys_node_module(sparent);
            }

            /* skip uses */
            sparent = lys_parent((struct lys_node *)elem);
            while (sparent && (sparent->nodetype == LYS_USES)) {
                sparent = lys_parent(sparent);
            }
            if (!sparent || (lys_node_module((struct lys_node *)elem) != top_smodule) || schema_all_prefixes) {
                prefix = lys_node_module((struct lys_node *)elem)->name;
            } else {
                prefix = NULL;
            }

            if (((struct lys_node *)elem)->nodetype & (LYS_AUGMENT | LYS_GROUPING)) {
                if (ly_vlog_build_path_print(path, &index, "]", 1, &length)) {
                    return -1;
                }

                name = ((struct lys_node *)elem)->name;
                if (ly_vlog_build_path_print(path, &index, name, strlen(name), &length)) {
                    return -1;
                }

                if (((struct lys_node *)elem)->nodetype == LYS_GROUPING) {
                    name = "{grouping}[";
                } else { /* augment */
                    name = "{augment}[";
                }
            } else if (((struct lys_node *)elem)->nodetype == LYS_EXT) {
                name = ((struct lys_ext_instance *)elem)->def->name;
                if (!strcmp(name, "yang-data")) {
                    yang_data_extension = 1;
                    name = ((struct lys_ext_instance *)elem)->arg_value;
                    prefix = lys_node_module((struct lys_node *)elem)->name;
                }
            } else {
                name = ((struct lys_node *)elem)->name;
            }

            if (((struct lys_node *)elem)->nodetype == LYS_EXT) {
                if (((struct lys_ext_instance*)elem)->parent_type == LYEXT_PAR_NODE) {
                    elem = (struct lys_node*)((struct lys_ext_instance*)elem)->parent;
                } else {
                    sparent = NULL;
                    elem = NULL;
                }
                break;
            }

            /* need to find the parent again because we don't want to skip augments */
            do {
                sparent = ((struct lys_node *)elem)->parent;
                elem = lys_parent((struct lys_node *)elem);
            } while (elem && (((struct lys_node *)elem)->nodetype == LYS_USES));
            break;
        case LY_VLOG_LYD:
            name = ((struct lyd_node *)elem)->schema->name;
            if (!((struct lyd_node *)elem)->parent ||
                    lyd_node_module((struct lyd_node *)elem) != lyd_node_module(((struct lyd_node *)elem)->parent)) {
                prefix = lyd_node_module((struct lyd_node *)elem)->name;
            } else {
                prefix = NULL;
            }

            /* handle predicates (keys) in case of lists */
            if (!data_no_last_predicate || index) {
                if (((struct lyd_node *)elem)->schema->nodetype == LYS_LIST) {
                    dlist = (struct lyd_node *)elem;
                    slist = (struct lys_node_list *)((struct lyd_node *)elem)->schema;
                    if (slist->keys_size) {
                        /* schema list with keys - use key values in predicates */
                        for (i = slist->keys_size - 1; i > -1; i--) {
                            LY_TREE_FOR(dlist->child, diter) {
                                if (diter->schema == (struct lys_node *)slist->keys[i]) {
                                    break;
                                }
                            }
                            if (diter && ((struct lyd_node_leaf_list *)diter)->value_str) {
                                if (strchr(((struct lyd_node_leaf_list *)diter)->value_str, '\'')) {
                                    val_start = "=\"";
                                    val_end = "\"]";
                                } else {
                                    val_start = "='";
                                    val_end = "']";
                                }

                                /* print value */
                                if (ly_vlog_build_path_print(path, &index, val_end, 2, &length)) {
                                    return -1;
                                }
                                len = strlen(((struct lyd_node_leaf_list *)diter)->value_str);
                                if (ly_vlog_build_path_print(path, &index,
                                        ((struct lyd_node_leaf_list *)diter)->value_str, len, &length)) {
                                    return -1;
                                }

                                /* print schema name */
                                if (ly_vlog_build_path_print(path, &index, val_start, 2, &length)) {
                                    return -1;
                                }
                                len = strlen(diter->schema->name);
                                if (ly_vlog_build_path_print(path, &index, diter->schema->name, len, &length)) {
                                    return -1;
                                }

                                if (lyd_node_module(dlist) != lyd_node_module(diter)) {
                                    if (ly_vlog_build_path_print(path, &index, ":", 1, &length)) {
                                        return -1;
                                    }
                                    len = strlen(lyd_node_module(diter)->name);
                                    if (ly_vlog_build_path_print(path, &index, lyd_node_module(diter)->name, len, &length)) {
                                        return -1;
                                    }
                                }

                                if (ly_vlog_build_path_print(path, &index, "[", 1, &length)) {
                                    return -1;
                                }
                            }
                        }
                    } else {
                        /* schema list without keys - use instance position */
                        i = j = lyd_list_pos(dlist);
                        len = 1;
                        while (j > 9) {
                            ++len;
                            j /= 10;
                        }

                        if (ly_vlog_build_path_print(path, &index, "]", 1, &length)) {
                            return -1;
                        }

                        str = malloc(len + 1);
                        LY_CHECK_ERR_RETURN(!str, LOGMEM(NULL), -1);
                        sprintf(str, "%d", i);

                        if (ly_vlog_build_path_print(path, &index, str, len, &length)) {
                            free(str);
                            return -1;
                        }
                        free(str);

                        if (ly_vlog_build_path_print(path, &index, "[", 1, &length)) {
                            return -1;
                        }
                    }
                } else if (((struct lyd_node *)elem)->schema->nodetype == LYS_LEAFLIST &&
                        ((struct lyd_node_leaf_list *)elem)->value_str) {
                    if (strchr(((struct lyd_node_leaf_list *)elem)->value_str, '\'')) {
                        val_start = "[.=\"";
                        val_end = "\"]";
                    } else {
                        val_start = "[.='";
                        val_end = "']";
                    }

                    if (ly_vlog_build_path_print(path, &index, val_end, 2, &length)) {
                        return -1;
                    }
                    len = strlen(((struct lyd_node_leaf_list *)elem)->value_str);
                    if (ly_vlog_build_path_print(path, &index, ((struct lyd_node_leaf_list *)elem)->value_str, len, &length)) {
                        return -1;
                    }
                    if (ly_vlog_build_path_print(path, &index, val_start, 4, &length)) {
                        return -1;
                    }
                }
            }

            /* check if it is yang-data top element */
            if (!((struct lyd_node *)elem)->parent) {
                ext_name = lyp_get_yang_data_template_name(elem);
                if (ext_name) {
                    if (ly_vlog_build_path_print(path, &index, name, strlen(name), &length)) {
                        return -1;
                    }
                    if (ly_vlog_build_path_print(path, &index, "/", 1, &length)) {
                        return -1;
                    }
                    yang_data_extension = 1;
                    name = ext_name;
               }
            }

            elem = ((struct lyd_node *)elem)->parent;
            break;
        case LY_VLOG_STR:
            len = strlen((const char *)elem);
            if (ly_vlog_build_path_print(path, &index, (const char *)elem, len, &length)) {
                return -1;
            }
            goto success;
        default:
            /* shouldn't be here */
            LOGINT(NULL);
            return -1;
        }
        if (name) {
            if (ly_vlog_build_path_print(path, &index, name, strlen(name), &length)) {
                return -1;
            }
            if (prefix) {
                if (yang_data_extension && ly_vlog_build_path_print(path, &index, "#", 1, &length)) {
                    return -1;
                }
                if (ly_vlog_build_path_print(path, &index, ":", 1, &length)) {
                    return -1;
                }
                if (ly_vlog_build_path_print(path, &index, prefix, strlen(prefix), &length)) {
                    return -1;
                }
            }
        }
        if (ly_vlog_build_path_print(path, &index, "/", 1, &length)) {
            return -1;
        }
        if ((elem_type == LY_VLOG_LYS) && !elem && sparent && (sparent->nodetype == LYS_AUGMENT)) {
            len = strlen(((struct lys_node_augment *)sparent)->target_name);
            if (ly_vlog_build_path_print(path, &index, ((struct lys_node_augment *)sparent)->target_name, len, &length)) {
                return -1;
            }
        }
    }

success:
    memmove(*path, (*path) + index, length);
    (*path)[length] = '\0';
    return 0;
}